

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMutex.cpp
# Opt level: O0

void __thiscall de::Mutex::Mutex(Mutex *this,deUint32 flags)

{
  deMutex dVar1;
  bad_alloc *this_00;
  deMutexAttributes local_18;
  deUint32 local_14;
  deMutexAttributes attribs;
  deUint32 flags_local;
  Mutex *this_local;
  
  this->m_mutex = 0;
  local_14 = flags;
  _attribs = this;
  ::deMemset(&local_18,0,4);
  local_18.flags = local_14;
  dVar1 = deMutex_create(&local_18);
  this->m_mutex = dVar1;
  if (this->m_mutex == 0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return;
}

Assistant:

Mutex::Mutex (deUint32 flags)
	: m_mutex(0)
{
	deMutexAttributes attribs;
	deMemset(&attribs, 0, sizeof(attribs));
	attribs.flags = flags;

	m_mutex = deMutex_create(&attribs);
	if (!m_mutex)
		throw std::bad_alloc();
}